

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ShuffleChannel_x86::forward
          (ShuffleChannel_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  bool bVar42;
  long local_150;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  Mat local_118;
  Mat local_c8;
  Option opt_pack;
  
  iVar37 = bottom_blob->elempack;
  if (iVar37 == 0) {
    uVar27 = 0;
  }
  else {
    sVar4 = bottom_blob->elemsize;
    uVar27 = ((int)sVar4 * 8) / iVar37;
    if (uVar27 == 0x20) {
      uVar27 = bottom_blob->c;
      if ((this->super_ShuffleChannel).reverse == 0) {
        iVar39 = (this->super_ShuffleChannel).group;
      }
      else {
        iVar39 = (int)(uVar27 * iVar37) / (this->super_ShuffleChannel).group;
      }
      uVar35 = (long)(int)uVar27 / (long)iVar39;
      uVar30 = uVar35 & 0xffffffff;
      if (iVar39 == 1) {
        if (top_blob != bottom_blob) {
          piVar5 = bottom_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->c = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          piVar5 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar5;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar37 = bottom_blob->w;
          iVar39 = bottom_blob->h;
          iVar3 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar37;
          top_blob->h = iVar39;
          top_blob->d = iVar3;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
          return 0;
        }
      }
      else {
        if (iVar37 != 4) {
LAB_003f268e:
          iVar37 = ShuffleChannel::forward(&this->super_ShuffleChannel,bottom_blob,top_blob,opt);
          return iVar37;
        }
        iVar37 = bottom_blob->w;
        iVar3 = bottom_blob->h;
        iVar31 = iVar3 * iVar37;
        iVar40 = (int)uVar35;
        if ((uVar27 & 1) == 0 || iVar39 != 2) {
          if ((4 < iVar39) || ((int)uVar27 % iVar39 != 0)) {
            opt_pack.lightmode = opt->lightmode;
            opt_pack.use_shader_pack8 = opt->use_shader_pack8;
            opt_pack.use_subgroup_ops = opt->use_subgroup_ops;
            opt_pack.use_reserved_0 = opt->use_reserved_0;
            opt_pack.num_threads = opt->num_threads;
            opt_pack.workspace_allocator = opt->workspace_allocator;
            opt_pack.openmp_blocktime = opt->openmp_blocktime;
            opt_pack.use_winograd_convolution = opt->use_winograd_convolution;
            opt_pack.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_pack.use_int8_inference = opt->use_int8_inference;
            opt_pack.use_vulkan_compute = opt->use_vulkan_compute;
            opt_pack.use_bf16_storage = opt->use_bf16_storage;
            opt_pack.use_fp16_packed = opt->use_fp16_packed;
            opt_pack.use_fp16_storage = opt->use_fp16_storage;
            opt_pack.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_pack.use_int8_packed = opt->use_int8_packed;
            opt_pack.use_int8_storage = opt->use_int8_storage;
            opt_pack.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_pack.use_packing_layout = opt->use_packing_layout;
            opt_pack.vulkan_device_index = opt->vulkan_device_index;
            opt_pack.use_reserved_1 = opt->use_reserved_1;
            opt_pack.use_image_storage = opt->use_image_storage;
            opt_pack.use_tensor_storage = opt->use_tensor_storage;
            opt_pack.use_reserved_2 = opt->use_reserved_2;
            opt_pack.flush_denormals = opt->flush_denormals;
            opt_pack.use_local_pool_allocator = opt->use_local_pool_allocator;
            opt_pack.use_shader_local_memory = opt->use_shader_local_memory;
            opt_pack.use_cooperative_matrix = opt->use_cooperative_matrix;
            opt_pack.use_winograd23_convolution = opt->use_winograd23_convolution;
            opt_pack.use_winograd43_convolution = opt->use_winograd43_convolution;
            opt_pack.use_winograd63_convolution = opt->use_winograd63_convolution;
            opt_pack.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
            opt_pack.use_fp16_uniform = opt->use_fp16_uniform;
            opt_pack.use_int8_uniform = opt->use_int8_uniform;
            opt_pack.use_reserved_9 = opt->use_reserved_9;
            opt_pack.use_reserved_10 = opt->use_reserved_10;
            opt_pack.use_reserved_11 = opt->use_reserved_11;
            opt_pack.blob_allocator = opt->workspace_allocator;
            local_c8.cstep = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8._20_8_ = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            convert_packing(bottom_blob,&local_c8,1,&opt_pack);
            local_118.cstep = 0;
            local_118.data = (void *)0x0;
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = 0;
            local_118._20_8_ = 0;
            local_118.allocator = (Allocator *)0x0;
            local_118.dims = 0;
            local_118.w = 0;
            local_118.h = 0;
            local_118.d = 0;
            local_118.c = 0;
            iVar37 = ShuffleChannel::forward
                               (&this->super_ShuffleChannel,&local_c8,&local_118,&opt_pack);
            if (iVar37 == 0) {
              convert_packing(&local_118,top_blob,4,opt);
            }
            piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_118.allocator == (Allocator *)0x0) {
                  free(local_118.data);
                }
                else {
                  (*(local_118.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar5 == (int *)0x0) {
              return iVar37;
            }
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 != 0) {
              return iVar37;
            }
            if (local_c8.allocator != (Allocator *)0x0) {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              return iVar37;
            }
            free(local_c8.data);
            return iVar37;
          }
          Mat::create(top_blob,iVar37,iVar3,uVar27,sVar4,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          if (iVar39 != 2) {
            if (iVar39 == 3) {
              if (iVar31 < 1) {
                iVar31 = 0;
              }
              lVar29 = (long)(iVar40 * 2);
              lVar41 = (long)iVar40;
              if (iVar40 < 1) {
                uVar30 = 0;
              }
              lVar32 = 1;
              lVar33 = 2;
              lVar38 = 0;
              for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
                pvVar6 = bottom_blob->data;
                pvVar7 = top_blob->data;
                lVar34 = bottom_blob->cstep * bottom_blob->elemsize;
                lVar36 = top_blob->cstep * top_blob->elemsize;
                lVar28 = 0;
                iVar37 = iVar31;
                while (bVar42 = iVar37 != 0, iVar37 = iVar37 + -1, bVar42) {
                  puVar1 = (undefined4 *)((long)pvVar6 + lVar28 + lVar34 * uVar35);
                  uVar11 = puVar1[1];
                  uVar12 = puVar1[2];
                  uVar13 = puVar1[3];
                  puVar2 = (undefined4 *)((long)pvVar6 + lVar28 + lVar34 * lVar41);
                  uVar14 = *puVar2;
                  uVar15 = puVar2[1];
                  uVar16 = puVar2[2];
                  uVar17 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar6 + lVar28 + lVar34 * lVar29);
                  uVar18 = *puVar2;
                  uVar19 = puVar2[1];
                  uVar20 = puVar2[2];
                  uVar21 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar7 + lVar28 + lVar36 * lVar38);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar14;
                  puVar2[2] = uVar18;
                  puVar2[3] = uVar11;
                  puVar1 = (undefined4 *)((long)pvVar7 + lVar28 + lVar36 * lVar32);
                  *puVar1 = uVar15;
                  puVar1[1] = uVar19;
                  puVar1[2] = uVar12;
                  puVar1[3] = uVar16;
                  puVar1 = (undefined4 *)((long)pvVar7 + lVar28 + lVar36 * lVar33);
                  *puVar1 = uVar20;
                  puVar1[1] = uVar13;
                  puVar1[2] = uVar17;
                  puVar1[3] = uVar21;
                  lVar28 = lVar28 + 0x10;
                }
                lVar41 = lVar41 + 1;
                lVar29 = lVar29 + 1;
                lVar38 = lVar38 + 3;
                lVar32 = lVar32 + 3;
                lVar33 = lVar33 + 3;
              }
              return 0;
            }
            if (iVar39 == 4) {
              if (iVar31 < 1) {
                iVar31 = 0;
              }
              lVar41 = (long)(iVar40 * 3);
              lVar29 = (long)(iVar40 * 2);
              local_150 = (long)iVar40;
              if (iVar40 < 1) {
                uVar30 = 0;
              }
              local_128 = 1;
              local_130 = 2;
              local_138 = 3;
              local_140 = 0;
              for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
                pvVar6 = bottom_blob->data;
                pvVar7 = top_blob->data;
                lVar38 = bottom_blob->cstep * bottom_blob->elemsize;
                lVar32 = top_blob->cstep * top_blob->elemsize;
                lVar33 = 0;
                iVar37 = iVar31;
                while (bVar42 = iVar37 != 0, iVar37 = iVar37 + -1, bVar42) {
                  puVar1 = (undefined4 *)((long)pvVar6 + lVar33 + lVar38 * uVar35);
                  uVar11 = puVar1[1];
                  uVar12 = puVar1[2];
                  uVar13 = puVar1[3];
                  puVar2 = (undefined4 *)((long)pvVar6 + lVar33 + lVar38 * local_150);
                  uVar14 = *puVar2;
                  uVar15 = puVar2[1];
                  uVar16 = puVar2[2];
                  uVar17 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar6 + lVar33 + lVar38 * lVar29);
                  uVar18 = *puVar2;
                  uVar19 = puVar2[1];
                  uVar20 = puVar2[2];
                  uVar21 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar6 + lVar33 + lVar38 * lVar41);
                  uVar22 = *puVar2;
                  uVar23 = puVar2[1];
                  uVar24 = puVar2[2];
                  uVar25 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar7 + lVar33 + lVar32 * local_140);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar14;
                  puVar2[2] = uVar18;
                  puVar2[3] = uVar22;
                  puVar1 = (undefined4 *)((long)pvVar7 + lVar33 + lVar32 * local_128);
                  *puVar1 = uVar11;
                  puVar1[1] = uVar15;
                  puVar1[2] = uVar19;
                  puVar1[3] = uVar23;
                  puVar1 = (undefined4 *)((long)pvVar7 + lVar33 + lVar32 * local_130);
                  *puVar1 = uVar12;
                  puVar1[1] = uVar16;
                  puVar1[2] = uVar20;
                  puVar1[3] = uVar24;
                  puVar1 = (undefined4 *)((long)pvVar7 + lVar33 + lVar32 * local_138);
                  *puVar1 = uVar13;
                  puVar1[1] = uVar17;
                  puVar1[2] = uVar21;
                  puVar1[3] = uVar25;
                  lVar33 = lVar33 + 0x10;
                }
                local_150 = local_150 + 1;
                lVar29 = lVar29 + 1;
                lVar41 = lVar41 + 1;
                local_140 = local_140 + 4;
                local_128 = local_128 + 4;
                local_130 = local_130 + 4;
                local_138 = local_138 + 4;
              }
              return 0;
            }
            goto LAB_003f268e;
          }
          if (iVar31 < 1) {
            iVar31 = 0;
          }
          lVar29 = (long)iVar40;
          if (iVar40 < 1) {
            uVar30 = 0;
          }
          lVar41 = 1;
          lVar32 = 0;
          for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
            pvVar6 = bottom_blob->data;
            pvVar7 = top_blob->data;
            lVar38 = top_blob->cstep * top_blob->elemsize;
            lVar33 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar28 = 0;
            iVar37 = iVar31;
            while (bVar42 = iVar37 != 0, iVar37 = iVar37 + -1, bVar42) {
              puVar1 = (undefined4 *)((long)pvVar6 + lVar28 + lVar33 * uVar35);
              uVar11 = puVar1[1];
              uVar12 = puVar1[2];
              uVar13 = puVar1[3];
              puVar2 = (undefined4 *)((long)pvVar6 + lVar28 + lVar33 * lVar29);
              uVar14 = *puVar2;
              uVar15 = puVar2[1];
              uVar16 = puVar2[2];
              uVar17 = puVar2[3];
              puVar2 = (undefined4 *)((long)pvVar7 + lVar28 + lVar38 * lVar32);
              *puVar2 = *puVar1;
              puVar2[1] = uVar14;
              puVar2[2] = uVar11;
              puVar2[3] = uVar15;
              puVar1 = (undefined4 *)((long)pvVar7 + lVar28 + lVar38 * lVar41);
              *puVar1 = uVar12;
              puVar1[1] = uVar16;
              puVar1[2] = uVar13;
              puVar1[3] = uVar17;
              lVar28 = lVar28 + 0x10;
            }
            lVar41 = lVar41 + 2;
            lVar32 = lVar32 + 2;
            lVar29 = lVar29 + 1;
          }
        }
        else {
          Mat::create(top_blob,iVar37,iVar3,uVar27,sVar4,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          lVar29 = 0;
          if (iVar31 < 1) {
            iVar31 = 0;
          }
          lVar41 = (long)iVar40;
          uVar30 = 0;
          if (0 < iVar40) {
            uVar30 = uVar35 & 0xffffffff;
          }
          lVar32 = 1;
          uVar35 = 0;
          lVar38 = lVar41;
          lVar33 = lVar41;
          while( true ) {
            lVar33 = lVar33 + 1;
            pvVar6 = bottom_blob->data;
            sVar4 = bottom_blob->elemsize;
            sVar8 = bottom_blob->cstep;
            if (uVar35 == uVar30) break;
            pvVar7 = top_blob->data;
            lVar36 = top_blob->cstep * top_blob->elemsize;
            lVar28 = sVar8 * sVar4;
            lVar34 = 0;
            iVar37 = iVar31;
            while (bVar42 = iVar37 != 0, iVar37 = iVar37 + -1, bVar42) {
              puVar1 = (undefined4 *)((long)pvVar6 + lVar34 + lVar28 * uVar35);
              uVar11 = puVar1[1];
              uVar12 = puVar1[2];
              uVar13 = puVar1[3];
              lVar26 = lVar34 + lVar28 * lVar38;
              uVar14 = *(undefined4 *)((long)pvVar6 + lVar26 + 8);
              uVar15 = *(undefined4 *)((long)pvVar6 + lVar26 + 0xc);
              puVar2 = (undefined4 *)((long)pvVar6 + lVar34 + lVar28 * lVar33);
              uVar16 = *puVar2;
              uVar17 = puVar2[1];
              puVar2 = (undefined4 *)((long)pvVar7 + lVar34 + lVar36 * lVar29);
              *puVar2 = *puVar1;
              puVar2[1] = uVar14;
              puVar2[2] = uVar11;
              puVar2[3] = uVar15;
              puVar1 = (undefined4 *)((long)pvVar7 + lVar34 + lVar36 * lVar32);
              *puVar1 = uVar12;
              puVar1[1] = uVar16;
              puVar1[2] = uVar13;
              puVar1[3] = uVar17;
              lVar34 = lVar34 + 0x10;
            }
            uVar35 = uVar35 + 1;
            lVar32 = lVar32 + 2;
            lVar29 = lVar29 + 2;
            lVar38 = lVar38 + 1;
          }
          sVar9 = top_blob->cstep;
          sVar10 = top_blob->elemsize;
          pvVar7 = top_blob->data;
          lVar29 = 0;
          while (bVar42 = iVar31 != 0, iVar31 = iVar31 + -1, bVar42) {
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + sVar8 * lVar41 * sVar4);
            uVar11 = puVar1[1];
            puVar2 = (undefined4 *)((long)pvVar6 + lVar29 + sVar8 * (long)(iVar40 * 2) * sVar4 + 8);
            uVar12 = *puVar2;
            uVar13 = puVar2[1];
            puVar2 = (undefined4 *)((long)pvVar7 + lVar29 + (long)(iVar40 * 2) * sVar9 * sVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar12;
            puVar2[2] = uVar11;
            puVar2[3] = uVar13;
            lVar29 = lVar29 + 0x10;
          }
        }
      }
      return 0;
    }
  }
  fprintf(_stderr,"Elembits = %d is not implemented yet.",(ulong)uVar27);
  fputc(10,_stderr);
  return -100;
}

Assistant:

int ShuffleChannel_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();
    if (elembits != 32)
    {
        NCNN_LOGE("Elembits = %d is not implemented yet.", elembits);
        return -100;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    int _group = reverse ? channels * elempack / group : group;
    int channels_per_group = channels / _group;

    if (_group == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512i _idxlo = _mm512_set_epi64(
                             0x1700000007, 0x1600000006,
                             0x1500000005, 0x1400000004,
                             0x1300000003, 0x1200000002,
                             0x1100000001, 0x1000000000);
        __m512i _idxhi = _mm512_set_epi64(
                             0x1f0000000f, 0x1e0000000e,
                             0x1d0000000d, 0x1c0000000c,
                             0x1b0000000b, 0x1a0000000a,
                             0x1900000009, 0x1800000008);

        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    __m512 _p2 = _mm512_loadu_ps(ptr2);

                    __m512 _p12 = _mm512_castsi512_ps(
                                      _mm512_alignr_epi64(_mm512_castps_si512(_p2), _mm512_castps_si512(_p1), 4));

                    __m512 _lo = _mm512_permutex2var_ps(_p0, _idxlo, _p12);
                    __m512 _hi = _mm512_permutex2var_ps(_p0, _idxhi, _p12);

                    _mm512_storeu_ps(outptr0, _lo);
                    _mm512_storeu_ps(outptr1, _hi);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 8;

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr, _lo_);
                    _mm256_storeu_ps(outptr + 8, _hi_);

                    ptr0 += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);

                    __m512 _lo = _mm512_permutex2var_ps(_p0, _idxlo, _p1);
                    __m512 _hi = _mm512_permutex2var_ps(_p0, _idxhi, _p1);

                    _mm512_storeu_ps(outptr0, _lo);
                    _mm512_storeu_ps(outptr1, _hi);

                    ptr0 += 16;
                    ptr1 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    // TODO Naive implementation
                    /*
                    0123456789abcdef        0gw1hx2iy3jz4kA5
                    ghijklmnopqrstuv  --->  lB6mC7nD8oE9pFaq
                    wxyzABCDEFGHIJKL        GbrHcsIdtJeuKfvL
                    */

                    outptr0[0] = ptr0[0];
                    outptr0[1] = ptr1[0];
                    outptr0[2] = ptr2[0];
                    outptr0[3] = ptr0[1];
                    outptr0[4] = ptr1[1];
                    outptr0[5] = ptr2[1];
                    outptr0[6] = ptr0[2];
                    outptr0[7] = ptr1[2];
                    outptr0[8] = ptr2[2];
                    outptr0[9] = ptr0[3];
                    outptr0[10] = ptr1[3];
                    outptr0[11] = ptr2[3];
                    outptr0[12] = ptr0[4];
                    outptr0[13] = ptr1[4];
                    outptr0[14] = ptr2[4];
                    outptr0[15] = ptr0[5];

                    outptr1[0] = ptr1[5];
                    outptr1[1] = ptr2[5];
                    outptr1[2] = ptr0[6];
                    outptr1[3] = ptr1[6];
                    outptr1[4] = ptr2[6];
                    outptr1[5] = ptr0[7];
                    outptr1[6] = ptr1[7];
                    outptr1[7] = ptr2[7];
                    outptr1[8] = ptr0[8];
                    outptr1[9] = ptr1[8];
                    outptr1[10] = ptr2[8];
                    outptr1[11] = ptr0[9];
                    outptr1[12] = ptr1[9];
                    outptr1[13] = ptr2[9];
                    outptr1[14] = ptr0[10];
                    outptr1[15] = ptr1[10];

                    outptr2[0] = ptr2[10];
                    outptr2[1] = ptr0[11];
                    outptr2[2] = ptr1[11];
                    outptr2[3] = ptr2[11];
                    outptr2[4] = ptr0[12];
                    outptr2[5] = ptr1[12];
                    outptr2[6] = ptr2[12];
                    outptr2[7] = ptr0[13];
                    outptr2[8] = ptr1[13];
                    outptr2[9] = ptr2[13];
                    outptr2[10] = ptr0[14];
                    outptr2[11] = ptr1[14];
                    outptr2[12] = ptr2[14];
                    outptr2[13] = ptr0[15];
                    outptr2[14] = ptr1[15];
                    outptr2[15] = ptr2[15];

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    __m512 _p2 = _mm512_loadu_ps(ptr2);
                    __m512 _p3 = _mm512_loadu_ps(ptr3);

                    __m512 _lo02 = _mm512_permutex2var_ps(_p0, _idxlo, _p2);
                    __m512 _hi02 = _mm512_permutex2var_ps(_p0, _idxhi, _p2);
                    __m512 _lo13 = _mm512_permutex2var_ps(_p1, _idxlo, _p3);
                    __m512 _hi13 = _mm512_permutex2var_ps(_p1, _idxhi, _p3);

                    __m512 _lolo = _mm512_permutex2var_ps(_lo02, _idxlo, _lo13);
                    __m512 _lohi = _mm512_permutex2var_ps(_lo02, _idxhi, _lo13);
                    __m512 _hilo = _mm512_permutex2var_ps(_hi02, _idxlo, _hi13);
                    __m512 _hihi = _mm512_permutex2var_ps(_hi02, _idxhi, _hi13);

                    _mm512_storeu_ps(outptr0, _lolo);
                    _mm512_storeu_ps(outptr1, _lohi);
                    _mm512_storeu_ps(outptr2, _hilo);
                    _mm512_storeu_ps(outptr3, _hihi);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                }
            }

            return 0;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                ptr1 += 4;

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);

                    __m256 _p1 = _mm256_castps128_ps256(_mm_loadu_ps(ptr1));
                    _p1 = _mm256_insertf128_ps(_p1, _mm_loadu_ps(ptr2), 1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr0, _lo_);
                    _mm256_storeu_ps(outptr1, _hi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 4;

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p1);

                    _mm_storeu_ps(outptr, _lo);
                    _mm_storeu_ps(outptr + 4, _hi);

                    ptr0 += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);
            if (bottom_blob_unpacked.empty())
                return -100;

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr0, _lo_);
                    _mm256_storeu_ps(outptr1, _hi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    // TODO figure out a faster way
                    /*
                    01234567        08g19h2a
                    89abcdef  --->  i3bj4ck5
                    ghijklmn        dl6em7fn
                    */

                    __m256 _p0 = _mm256_loadu_ps(ptr0); // 01234567
                    __m256 _p1 = _mm256_loadu_ps(ptr1); // 89abcdef
                    __m256 _p2 = _mm256_loadu_ps(ptr2); // ghijklmn

                    __m256 _08194c5d = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _2a3b6e7f = _mm256_unpackhi_ps(_p0, _p1);
                    __m256 _8g9hckdl = _mm256_unpacklo_ps(_p1, _p2);
                    __m256 _aibjemfn = _mm256_unpackhi_ps(_p1, _p2);
                    __m256 _0g1h4k5l = _mm256_unpacklo_ps(_p0, _p2);
                    __m256 _2i3j6m7n = _mm256_unpackhi_ps(_p0, _p2);

                    __m256 _i3g1m7k5 = _mm256_shuffle_ps(_2i3j6m7n, _0g1h4k5l, _MM_SHUFFLE(2, 1, 2, 1));

                    __m256 _9h2adl6e = _mm256_shuffle_ps(_8g9hckdl, _2a3b6e7f, _MM_SHUFFLE(1, 0, 3, 2));
                    __m256 _08g14ck5 = _mm256_shuffle_ps(_08194c5d, _i3g1m7k5, _MM_SHUFFLE(3, 2, 1, 0));
                    __m256 _i3bjm7fn = _mm256_shuffle_ps(_i3g1m7k5, _aibjemfn, _MM_SHUFFLE(3, 2, 1, 0));

                    __m256 _08g19h2a = _mm256_permute2f128_ps(_08g14ck5, _9h2adl6e, 0x20); // 0 2
                    __m256 _i3bj4ck5 = _mm256_permute2f128_ps(_i3bjm7fn, _08g14ck5, 0x30); // 0 3
                    __m256 _dl6em7fn = _mm256_permute2f128_ps(_9h2adl6e, _i3bjm7fn, 0x31); // 1 3

                    _mm256_storeu_ps(outptr0, _08g19h2a);
                    _mm256_storeu_ps(outptr1, _i3bj4ck5);
                    _mm256_storeu_ps(outptr2, _dl6em7fn);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    __m256 _p2 = _mm256_loadu_ps(ptr2);
                    __m256 _p3 = _mm256_loadu_ps(ptr3);

                    __m256 _lo02 = _mm256_unpacklo_ps(_p0, _p2);
                    __m256 _hi02 = _mm256_unpackhi_ps(_p0, _p2);
                    __m256 _lo13 = _mm256_unpacklo_ps(_p1, _p3);
                    __m256 _hi13 = _mm256_unpackhi_ps(_p1, _p3);

                    __m256 _lolo = _mm256_unpacklo_ps(_lo02, _lo13);
                    __m256 _lohi = _mm256_unpackhi_ps(_lo02, _lo13);
                    __m256 _hilo = _mm256_unpacklo_ps(_hi02, _hi13);
                    __m256 _hihi = _mm256_unpackhi_ps(_hi02, _hi13);

                    __m256 _lolo_ = _mm256_permute2f128_ps(_lolo, _lohi, 0x20);
                    __m256 _lohi_ = _mm256_permute2f128_ps(_hilo, _hihi, 0x20);
                    __m256 _hilo_ = _mm256_permute2f128_ps(_lolo, _lohi, 0x31);
                    __m256 _hihi_ = _mm256_permute2f128_ps(_hilo, _hihi, 0x31);

                    _mm256_storeu_ps(outptr0, _lolo_);
                    _mm256_storeu_ps(outptr1, _lohi_);
                    _mm256_storeu_ps(outptr2, _hilo_);
                    _mm256_storeu_ps(outptr3, _hihi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                }
            }

            return 0;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);

                    __m128 _p12 = _mm_shuffle_ps(_p1, _p2, _MM_SHUFFLE(1, 0, 3, 2));

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p12);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p12);

                    _mm_storeu_ps(outptr0, _lo);
                    _mm_storeu_ps(outptr1, _hi);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 2;

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);

                    _mm_storeu_ps(outptr, _lo);

                    ptr0 += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p1);

                    _mm_storeu_ps(outptr0, _lo);
                    _mm_storeu_ps(outptr1, _hi);

                    ptr0 += 4;
                    ptr1 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);

                    __m128 _0415 = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _2637 = _mm_unpackhi_ps(_p0, _p1);
                    __m128 _4859 = _mm_unpacklo_ps(_p1, _p2);
                    __m128 _6a7b = _mm_unpackhi_ps(_p1, _p2);

                    __m128 _138a = _mm_shuffle_ps(_p0, _p2, _MM_SHUFFLE(2, 0, 3, 1));

                    __m128 _0481 = _mm_shuffle_ps(_0415, _138a, _MM_SHUFFLE(0, 2, 1, 0));
                    __m128 _5926 = _mm_shuffle_ps(_4859, _2637, _MM_SHUFFLE(1, 0, 3, 2));
                    __m128 _a37b = _mm_shuffle_ps(_138a, _6a7b, _MM_SHUFFLE(3, 2, 1, 3));

                    _mm_storeu_ps(outptr0, _0481);
                    _mm_storeu_ps(outptr1, _5926);
                    _mm_storeu_ps(outptr2, _a37b);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);
                    __m128 _p3 = _mm_loadu_ps(ptr3);

                    __m128 _lo02 = _mm_unpacklo_ps(_p0, _p2);
                    __m128 _hi02 = _mm_unpackhi_ps(_p0, _p2);
                    __m128 _lo13 = _mm_unpacklo_ps(_p1, _p3);
                    __m128 _hi13 = _mm_unpackhi_ps(_p1, _p3);

                    __m128 _lolo = _mm_unpacklo_ps(_lo02, _lo13);
                    __m128 _lohi = _mm_unpackhi_ps(_lo02, _lo13);
                    __m128 _hilo = _mm_unpacklo_ps(_hi02, _hi13);
                    __m128 _hihi = _mm_unpackhi_ps(_hi02, _hi13);

                    _mm_storeu_ps(outptr0, _lolo);
                    _mm_storeu_ps(outptr1, _lohi);
                    _mm_storeu_ps(outptr2, _hilo);
                    _mm_storeu_ps(outptr3, _hihi);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
            }

            return 0;
        }
    }
#endif // __SSE2__

    return ShuffleChannel::forward(bottom_blob, top_blob, opt);
}